

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreTexture.h
# Opt level: O1

void __thiscall
irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>::~COpenGLCoreTexture
          (COpenGLCoreTexture<irr::video::COpenGLDriver> *this,void **vtt)

{
  code *pcVar1;
  _func_int **pp_Var2;
  IImage *pIVar3;
  _func_int *p_Var4;
  pointer pcVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  pointer ppIVar7;
  ulong uVar8;
  
  pp_Var2 = (_func_int **)*vtt;
  (this->super_ITexture)._vptr_ITexture = pp_Var2;
  *(void **)((long)&(this->super_ITexture)._vptr_ITexture + (long)pp_Var2[-3]) = vtt[3];
  if (*(int *)&(this->super_ITexture).field_0x84 != 0) {
    (*GL.DeleteTextures)(1,(GLuint *)&(this->super_ITexture).field_0x84);
  }
  pIVar3 = this->LockImage;
  if (pIVar3 != (IImage *)0x0) {
    p_Var4 = pIVar3->_vptr_IImage[-3];
    pcVar1 = p_Var4 + 4 + (long)&(pIVar3->Size).Width;
    *(int *)pcVar1 = *(int *)pcVar1 + -1;
    if (*(int *)pcVar1 == 0) {
      (**(code **)(*(long *)((long)&pIVar3->_vptr_IImage + (long)p_Var4) + 8))();
    }
  }
  ppIVar7 = (this->Images).m_data.
            super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(this->Images).m_data.
                          super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar7) >> 3) != 0) {
    uVar8 = 0;
    do {
      pIVar3 = ppIVar7[uVar8];
      p_Var4 = pIVar3->_vptr_IImage[0xfffffffffffffffd];
      pcVar1 = p_Var4 + 4 + (long)&(pIVar3->Size).Width;
      *(int *)pcVar1 = *(int *)pcVar1 + -1;
      if (*(int *)pcVar1 == 0) {
        (**(code **)(*(long *)((long)&pIVar3->_vptr_IImage + (long)p_Var4) + 8))();
      }
      uVar8 = uVar8 + 1;
      ppIVar7 = (this->Images).m_data.
                super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar8 < ((ulong)((long)(this->Images).m_data.
                                    super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar7) >> 3
                     & 0xffffffff));
  }
  if (ppIVar7 != (pointer)0x0) {
    operator_delete(ppIVar7,(long)(this->Images).m_data.
                                  super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppIVar7
                   );
  }
  pp_Var2 = (_func_int **)vtt[1];
  (this->super_ITexture)._vptr_ITexture = pp_Var2;
  *(void **)((long)&(this->super_ITexture)._vptr_ITexture + (long)pp_Var2[-3]) = vtt[2];
  pcVar5 = (this->super_ITexture).NamedPath.InternalName.str._M_dataplus._M_p;
  paVar6 = &(this->super_ITexture).NamedPath.InternalName.str.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar6) {
    operator_delete(pcVar5,paVar6->_M_allocated_capacity + 1);
  }
  pcVar5 = (this->super_ITexture).NamedPath.Path.str._M_dataplus._M_p;
  paVar6 = &(this->super_ITexture).NamedPath.Path.str.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar6) {
    operator_delete(pcVar5,paVar6->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

virtual ~COpenGLCoreTexture()
	{
		if (TextureName)
			GL.DeleteTextures(1, &TextureName);

		if (LockImage)
			LockImage->drop();

		for (u32 i = 0; i < Images.size(); ++i)
			Images[i]->drop();
	}